

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O2

int64_t aom_sse_sse4_1(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  long lVar1;
  undefined4 in_register_0000000c;
  long lVar2;
  undefined4 in_register_00000034;
  int iVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  __m128i alVar7;
  __m128i alVar8;
  undefined1 in_XMM1 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  __m128i local_68;
  long local_50;
  long local_48;
  long local_40;
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000034,a_stride);
  local_50 = CONCAT44(in_register_0000000c,b_stride);
  alVar8[0] = 0;
  alVar8[1] = 0;
  local_68[0] = 0;
  local_68[1] = 0;
  if (width == 4) {
    local_50 = (long)(a_stride * 2);
    iVar3 = 0;
    do {
      sse4x2_sse4_1(a,a_stride,b,b_stride,&local_68);
      a = a + local_50;
      b = b + b_stride * 2;
      iVar3 = iVar3 + 2;
    } while (iVar3 < height);
  }
  else if (width == 8) {
    iVar3 = 0;
    do {
      auVar10 = pmovzxbw(in_XMM1,*(undefined8 *)a);
      in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)b);
      auVar12._0_2_ = auVar10._0_2_ - in_XMM2._0_2_;
      auVar12._2_2_ = auVar10._2_2_ - in_XMM2._2_2_;
      auVar12._4_2_ = auVar10._4_2_ - in_XMM2._4_2_;
      auVar12._6_2_ = auVar10._6_2_ - in_XMM2._6_2_;
      auVar12._8_2_ = auVar10._8_2_ - in_XMM2._8_2_;
      auVar12._10_2_ = auVar10._10_2_ - in_XMM2._10_2_;
      auVar12._12_2_ = auVar10._12_2_ - in_XMM2._12_2_;
      auVar12._14_2_ = auVar10._14_2_ - in_XMM2._14_2_;
      in_XMM1 = pmaddwd(auVar12,auVar12);
      local_68[0]._0_4_ = (int)alVar8[0] + in_XMM1._0_4_;
      local_68[0]._4_4_ = alVar8[0]._4_4_ + in_XMM1._4_4_;
      local_68[1]._0_4_ = (int)alVar8[1] + in_XMM1._8_4_;
      local_68[1]._4_4_ = alVar8[1]._4_4_ + in_XMM1._12_4_;
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
      alVar8 = local_68;
    } while (iVar3 < height);
  }
  else if (width == 0x10) {
    iVar3 = 0;
    do {
      sse_w16_sse4_1(&local_68,a,b);
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
    } while (iVar3 < height);
  }
  else if (width == 0x20) {
    iVar3 = 0;
    do {
      sse_w16_sse4_1(&local_68,a,b);
      sse_w16_sse4_1(&local_68,a + 0x10,b + 0x10);
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
    } while (iVar3 < height);
  }
  else if (width == 0x40) {
    puVar4 = b + 0x30;
    iVar3 = 0;
    do {
      sse_w16_sse4_1(&local_68,a,puVar4 + -0x30);
      sse_w16_sse4_1(&local_68,a + 0x10,puVar4 + -0x20);
      sse_w16_sse4_1(&local_68,a + 0x20,puVar4 + -0x10);
      sse_w16_sse4_1(&local_68,a + 0x30,puVar4);
      a = a + a_stride;
      iVar3 = iVar3 + 1;
      puVar4 = puVar4 + b_stride;
    } while (iVar3 < height);
  }
  else if (width == 0x80) {
    puVar4 = b + 0x70;
    puVar5 = a + 0x70;
    iVar3 = 0;
    do {
      sse_w16_sse4_1(&local_68,puVar5 + -0x70,puVar4 + -0x70);
      sse_w16_sse4_1(&local_68,puVar5 + -0x60,puVar4 + -0x60);
      sse_w16_sse4_1(&local_68,puVar5 + -0x50,puVar4 + -0x50);
      sse_w16_sse4_1(&local_68,puVar5 + -0x40,puVar4 + -0x40);
      sse_w16_sse4_1(&local_68,puVar5 + -0x30,puVar4 + -0x30);
      sse_w16_sse4_1(&local_68,puVar5 + -0x20,puVar4 + -0x20);
      sse_w16_sse4_1(&local_68,puVar5 + -0x10,puVar4 + -0x10);
      sse_w16_sse4_1(&local_68,puVar5,puVar4);
      iVar3 = iVar3 + 1;
      puVar4 = puVar4 + b_stride;
      puVar5 = puVar5 + a_stride;
    } while (iVar3 < height);
  }
  else if ((width & 7U) == 0) {
    iVar3 = 0;
    do {
      lVar2 = 0;
      alVar7 = alVar8;
      do {
        auVar10 = pmovzxbw(in_XMM1,*(undefined8 *)(a + lVar2));
        in_XMM2 = pmovzxbw(in_XMM2,*(undefined8 *)(b + lVar2));
        auVar11._0_2_ = auVar10._0_2_ - in_XMM2._0_2_;
        auVar11._2_2_ = auVar10._2_2_ - in_XMM2._2_2_;
        auVar11._4_2_ = auVar10._4_2_ - in_XMM2._4_2_;
        auVar11._6_2_ = auVar10._6_2_ - in_XMM2._6_2_;
        auVar11._8_2_ = auVar10._8_2_ - in_XMM2._8_2_;
        auVar11._10_2_ = auVar10._10_2_ - in_XMM2._10_2_;
        auVar11._12_2_ = auVar10._12_2_ - in_XMM2._12_2_;
        auVar11._14_2_ = auVar10._14_2_ - in_XMM2._14_2_;
        in_XMM1 = pmaddwd(auVar11,auVar11);
        alVar8[0]._0_4_ = (int)alVar7[0] + in_XMM1._0_4_;
        alVar8[0]._4_4_ = alVar7[0]._4_4_ + in_XMM1._4_4_;
        alVar8[1]._0_4_ = (int)alVar7[1] + in_XMM1._8_4_;
        alVar8[1]._4_4_ = alVar7[1]._4_4_ + in_XMM1._12_4_;
        lVar2 = lVar2 + 8;
        alVar7 = alVar8;
      } while (lVar2 < width);
      a = a + a_stride;
      b = b + b_stride;
      iVar3 = iVar3 + 1;
      local_68 = alVar8;
    } while (iVar3 < height);
  }
  else {
    local_40 = (long)(a_stride * 2);
    local_48 = (long)(b_stride * 2);
    puVar5 = b + b_stride;
    puVar4 = a + a_stride;
    iVar3 = 0;
    do {
      lVar2 = -8;
      do {
        lVar1 = lVar2;
        auVar10 = pmovzxbw(in_XMM1,*(undefined8 *)(a + lVar1 + 8));
        auVar12 = pmovzxbw(in_XMM2,*(undefined8 *)(b + lVar1 + 8));
        auVar9._0_2_ = auVar10._0_2_ - auVar12._0_2_;
        auVar9._2_2_ = auVar10._2_2_ - auVar12._2_2_;
        auVar9._4_2_ = auVar10._4_2_ - auVar12._4_2_;
        auVar9._6_2_ = auVar10._6_2_ - auVar12._6_2_;
        auVar9._8_2_ = auVar10._8_2_ - auVar12._8_2_;
        auVar9._10_2_ = auVar10._10_2_ - auVar12._10_2_;
        auVar9._12_2_ = auVar10._12_2_ - auVar12._12_2_;
        auVar9._14_2_ = auVar10._14_2_ - auVar12._14_2_;
        auVar10 = pmaddwd(auVar9,auVar9);
        in_XMM1._0_4_ = auVar10._0_4_ + (int)local_68[0];
        in_XMM1._4_4_ = auVar10._4_4_ + local_68[0]._4_4_;
        in_XMM1._8_4_ = auVar10._8_4_ + (int)local_68[1];
        in_XMM1._12_4_ = auVar10._12_4_ + local_68[1]._4_4_;
        auVar10 = pmovzxbw((undefined1  [16])local_68,*(undefined8 *)(puVar4 + lVar1 + 8));
        in_XMM2 = pmovzxbw(auVar12,*(undefined8 *)(puVar5 + lVar1 + 8));
        auVar6._0_2_ = auVar10._0_2_ - in_XMM2._0_2_;
        auVar6._2_2_ = auVar10._2_2_ - in_XMM2._2_2_;
        auVar6._4_2_ = auVar10._4_2_ - in_XMM2._4_2_;
        auVar6._6_2_ = auVar10._6_2_ - in_XMM2._6_2_;
        auVar6._8_2_ = auVar10._8_2_ - in_XMM2._8_2_;
        auVar6._10_2_ = auVar10._10_2_ - in_XMM2._10_2_;
        auVar6._12_2_ = auVar10._12_2_ - in_XMM2._12_2_;
        auVar6._14_2_ = auVar10._14_2_ - in_XMM2._14_2_;
        auVar10 = pmaddwd(auVar6,auVar6);
        local_68[0]._0_4_ = auVar10._0_4_ + in_XMM1._0_4_;
        local_68[0]._4_4_ = auVar10._4_4_ + in_XMM1._4_4_;
        local_68[1]._0_4_ = auVar10._8_4_ + in_XMM1._8_4_;
        local_68[1]._4_4_ = auVar10._12_4_ + in_XMM1._12_4_;
        lVar2 = lVar1 + 8;
      } while (lVar1 + 8 < (long)width + -0xc);
      sse4x2_sse4_1(a + lVar1 + 0x10,(int)local_38,b + lVar1 + 0x10,(int)local_50,&local_68);
      a = a + local_40;
      b = b + local_48;
      iVar3 = iVar3 + 2;
      puVar5 = puVar5 + local_48;
      puVar4 = puVar4 + local_40;
    } while (iVar3 < height);
  }
  auVar10 = pmovzxdq(in_XMM1,(undefined1  [16])local_68);
  return (ulong)local_68[1]._4_4_ + auVar10._8_8_ + (ulong)(uint)local_68[1] + auVar10._0_8_;
}

Assistant:

int64_t aom_sse_sse4_1(const uint8_t *a, int a_stride, const uint8_t *b,
                       int b_stride, int width, int height) {
  int y = 0;
  int64_t sse = 0;
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        sse4x2_sse4_1(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        sse8_sse4_1(a, b, &sum);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        sse_w16_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 32:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16, b + 16);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 64:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 128:
      do {
        sse_w16_sse4_1(&sum, a, b);
        sse_w16_sse4_1(&sum, a + 16 * 1, b + 16 * 1);
        sse_w16_sse4_1(&sum, a + 16 * 2, b + 16 * 2);
        sse_w16_sse4_1(&sum, a + 16 * 3, b + 16 * 3);
        sse_w16_sse4_1(&sum, a + 16 * 4, b + 16 * 4);
        sse_w16_sse4_1(&sum, a + 16 * 5, b + 16 * 5);
        sse_w16_sse4_1(&sum, a + 16 * 6, b + 16 * 6);
        sse_w16_sse4_1(&sum, a + 16 * 7, b + 16 * 7);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    default:
      if (width & 0x07) {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            sse8_sse4_1(a + i + a_stride, b + i + b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse4x2_sse4_1(a + i, a_stride, b + i, b_stride, &sum);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse8_sse4_1(a + i, b + i, &sum);
            i += 8;
          } while (i < width);
          a += a_stride;
          b += b_stride;
          y += 1;
        } while (y < height);
      }
      sse = summary_all_sse4(&sum);
      break;
  }

  return sse;
}